

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall Cart::Cart(Cart *this,Buffer *rom,Variant variant)

{
  uchar x;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_long> __l_00;
  size_type x_00;
  const_reference pvVar1;
  byte *pbVar2;
  bool local_102;
  allocator<unsigned_char> local_dc;
  uchar local_db [3];
  iterator local_d8;
  size_type local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  allocator<unsigned_long> local_99;
  unsigned_long local_98 [10];
  iterator local_48;
  size_type local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  Variant local_1c;
  Buffer *pBStack_18;
  Variant variant_local;
  Buffer *rom_local;
  Cart *this_local;
  
  local_1c = variant;
  pBStack_18 = rom;
  rom_local = (Buffer *)this;
  x_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(rom);
  local_98[6] = 0x200000;
  local_98[7] = 0x400000;
  local_98[4] = 0x80000;
  local_98[5] = 0x100000;
  local_98[2] = 0x20000;
  local_98[3] = 0x40000;
  local_98[0] = 0x8000;
  local_98[1] = 0x10000;
  local_98[8] = 0x800000;
  local_48 = local_98;
  local_40 = 9;
  std::allocator<unsigned_long>::allocator(&local_99);
  __l_00._M_len = local_40;
  __l_00._M_array = local_48;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_38,__l_00,&local_99);
  ThrowUnlessContains<unsigned_long>(x_00,&local_38,"Invalid ROM size.");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_38);
  std::allocator<unsigned_long>::~allocator(&local_99);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pBStack_18,0x143);
  x = *pvVar1;
  local_db[0] = '\0';
  local_db[1] = 0x80;
  local_db[2] = 0xc0;
  local_d8 = local_db;
  local_d0 = 3;
  std::allocator<unsigned_char>::allocator(&local_dc);
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_c8,__l,&local_dc);
  ThrowUnlessContains<unsigned_char>(x,&local_c8,"Invalid cgb flag.");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_c8);
  std::allocator<unsigned_char>::~allocator(&local_dc);
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pBStack_18,0x143);
  this->cgb = (uint)*pbVar2;
  local_102 = true;
  if ((this->cgb == Required) && (local_102 = true, local_1c != CGB)) {
    local_102 = local_1c == Guess;
  }
  ThrowUnless(local_102,"Variant requires CGB.");
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pBStack_18,0x147);
  (*(code *)(&DAT_00118010 + *(int *)(&DAT_00118010 + (ulong)*pbVar2 * 4)))();
  return;
}

Assistant:

Cart::Cart(const Buffer& rom, Variant variant) {
  ThrowUnlessContains(rom.size(),
                      {1u << 15, 1u << 16, 1u << 17, 1u << 18, 1u << 19,
                       1u << 20, 1u << 21, 1u << 22, 1u << 23},
                      "Invalid ROM size.");

  ThrowUnlessContains(rom[0x143], {0, 0x80, 0xc0}, "Invalid cgb flag.");
  cgb = static_cast<CGB>(rom[0x143]);

  ThrowUnless(cgb != CGB::Required || variant == Variant::CGB ||
                  variant == Variant::Guess,
              "Variant requires CGB.");

  switch (rom[0x147]) {
    case 0: case 8: case 9: case 252: mbc = MBC::None; break;
    case 1: case 2: case 3: mbc = MBC::_1; break;
    case 5: case 6: mbc = MBC::_2; break;
    case 11: case 12: case 14: mbc = MBC::MMM01; break;
    case 15: case 16: case 17: case 18: case 19: mbc = MBC::_3; break;
    case 25: case 26: case 27: case 28: case 29: case 30: mbc = MBC::_5; break;
    case 253: mbc = MBC::TAMA5; break;
    case 254: mbc = MBC::HUC3; break;
    case 255: mbc = MBC::HUC1; break;
    default: throw Error("Invalid cart type");
  }

  ThrowUnless(rom[0x148] <= 8, "Invalid ROM size.");
  rom_size = static_cast<ROMSize>(rom[0x148]);
  rom_bank_mask = (2 << (u8)rom_size) - 1;

  ThrowUnless(rom[0x149] <= 5, "Invalid SRAM size.");
  sram_size = static_cast<SRAMSize>(rom[0x149]);
  if (mbc == MBC::_2) {
    sram_bank_mask = 0;
    sram_addr_mask = 0x1ff;
  } else {
    switch (sram_size) {
      case SRAMSize::None: sram_bank_mask = sram_addr_mask = 0; break;
      case SRAMSize::_2k: sram_bank_mask = 0; sram_addr_mask = 0x7ff; break;
      case SRAMSize::_8k: sram_bank_mask = 0; sram_addr_mask = 0x1fff; break;
      case SRAMSize::_32k: sram_bank_mask = 3; sram_addr_mask = 0x1fff; break;
      case SRAMSize::_128k: sram_bank_mask = 15; sram_addr_mask = 0x1fff; break;
      case SRAMSize::_64k: sram_bank_mask = 7; sram_addr_mask = 0x1fff; break;
    }
  }
}